

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

void __thiscall
pstore::small_vector<int,_3UL>::small_vector
          (small_vector<int,_3UL> *this,small_vector<int,_3UL> *rhs)

{
  (this->big_buffer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->big_buffer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->big_buffer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->small_buffer_)._M_elems[2] = 0;
  this->elements_ = 0;
  (this->small_buffer_)._M_elems[0] = 0;
  (this->small_buffer_)._M_elems[1] = 0;
  this->buffer_ = (this->small_buffer_)._M_elems;
  reserve(this,rhs->elements_);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<pstore::pointer_based_iterator<int_const>,std::back_insert_iterator<pstore::small_vector<int,3ul>>>
            ((pointer_based_iterator<const_int>)rhs->buffer_,
             (pointer_based_iterator<const_int>)(rhs->buffer_ + rhs->elements_),
             (back_insert_iterator<pstore::small_vector<int,_3UL>_>)this);
  return;
}

Assistant:

small_vector<ElementType, BodyElements>::small_vector (small_vector const & rhs)
            : small_vector () {
        this->reserve (rhs.size ());
        std::copy (std::begin (rhs), std::end (rhs), std::back_inserter (*this));
    }